

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat2wasm.cc
# Opt level: O2

int ProgramMain(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *start;
  _Alloc_hider _Var2;
  char *pcVar3;
  Result RVar4;
  char *pcVar5;
  size_t sVar6;
  Callback *callback;
  size_type extraout_RDX;
  uint uVar7;
  string_view filename;
  string_view filename_00;
  string_view filename_01;
  string_view filename_02;
  string_view sVar8;
  size_t in_stack_fffffffffffffeb0;
  unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  line_finder;
  undefined8 uVar9;
  code *pcVar10;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> module;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> lexer;
  Errors errors;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  OptionParser parser;
  WastParseOptions parse_wast_options;
  string_view local_38;
  
  wabt::InitStdio();
  wabt::OptionParser::OptionParser
            (&parser,"wat2wasm",
             "  read a file in the wasm text format, check it for errors, and\n  convert it to the wasm binary format.\n\nexamples:\n  # parse and typecheck test.wat\n  $ wat2wasm test.wat\n\n  # parse test.wat and write to binary file test.wasm\n  $ wat2wasm test.wat -o test.wasm\n\n  # parse spec-test.wast, and write verbose output to stdout (including\n  # the meaning of every byte)\n  $ wat2wasm spec-test.wast -v\n"
            );
  line_finder._M_t.
  super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
  .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
        )(__uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
          )0x0;
  pcVar10 = std::
            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:70:72)>
            ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'v',"verbose","Use multiple times for more info",(NullCallback *)&line_finder);
  if (pcVar10 != (_Manager_type)0x0) {
    (*pcVar10)(&line_finder,&line_finder,3);
  }
  line_finder._M_t.
  super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
  .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
        )(__uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
          )0x0;
  pcVar10 = std::
            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:75:20)>
            ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"debug-parser","Turn on debugging the parser of wat files",
             (NullCallback *)&line_finder);
  if (pcVar10 != (_Manager_type)0x0) {
    (*pcVar10)(&line_finder,&line_finder,3);
  }
  line_finder._M_t.
  super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
  .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
        )(__uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
          )0x0;
  pcVar10 = std::
            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:78:20)>
            ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'d',"dump-module","Print a hexdump of the module to stdout",
             (NullCallback *)&line_finder);
  if (pcVar10 != (_Manager_type)0x0) {
    (*pcVar10)(&line_finder,&line_finder,3);
  }
  wabt::Features::AddOptions(&s_features,&parser);
  line_finder._M_t.
  super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
  .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
        )(__uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
          )0x0;
  pcVar10 = std::
            _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:81:20)>
            ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'o',"output","FILE","output wasm binary file",(Callback *)&line_finder);
  if (pcVar10 != (_Manager_type)0x0) {
    (*pcVar10)(&line_finder,&line_finder,3);
  }
  line_finder._M_t.
  super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
  .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
        )(__uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
          )0x0;
  pcVar10 = std::
            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:85:7)>
            ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'r',"relocatable",
             "Create a relocatable wasm binary (suitable for linking with e.g. lld)",
             (NullCallback *)&line_finder);
  if (pcVar10 != (_Manager_type)0x0) {
    (*pcVar10)(&line_finder,&line_finder,3);
  }
  line_finder._M_t.
  super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
  .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
        )(__uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
          )0x0;
  pcVar10 = std::
            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:89:7)>
            ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"no-canonicalize-leb128s",
             "Write all LEB128 sizes as 5-bytes instead of their minimal size",
             (NullCallback *)&line_finder);
  if (pcVar10 != (_Manager_type)0x0) {
    (*pcVar10)(&line_finder,&line_finder,3);
  }
  line_finder._M_t.
  super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
  .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
        )(__uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
          )0x0;
  pcVar10 = std::
            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:92:20)>
            ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"debug-names","Write debug names to the generated binary file",
             (NullCallback *)&line_finder);
  if (pcVar10 != (_Manager_type)0x0) {
    (*pcVar10)(&line_finder,&line_finder,3);
  }
  line_finder._M_t.
  super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
  .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
        )(__uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
          )0x0;
  uVar9 = (char *)0x0;
  pcVar10 = std::
            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:94:20)>
            ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"no-check","Don\'t check for invalid modules",(NullCallback *)&line_finder);
  if (pcVar10 != (_Manager_type)0x0) {
    (*pcVar10)(&line_finder,&line_finder,3);
  }
  std::__cxx11::string::string((string *)&line_finder,"filename",(allocator *)&errors);
  callback = (Callback *)&file_data;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:96:22)>
                ::_M_manager;
  wabt::OptionParser::AddArgument(&parser,(string *)&line_finder,One,callback);
  if (file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)(&file_data,&file_data,3);
  }
  std::__cxx11::string::_M_dispose();
  wabt::OptionParser::Parse(&parser,argc,argv);
  wabt::OptionParser::~OptionParser(&parser);
  pcVar3 = s_infile;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar5 = (char *)strlen(s_infile);
  filename.size_ = (size_type)&file_data;
  filename.data_ = pcVar5;
  RVar4 = wabt::ReadFile((wabt *)pcVar3,filename,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)callback);
  strlen(s_infile);
  sVar8.size_ = (size_type)pcVar10;
  sVar8.data_ = (char *)uVar9;
  wabt::WastLexer::CreateBufferLexer
            (sVar8,(void *)line_finder._M_t.
                           super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
                           .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl
             ,in_stack_fffffffffffffeb0);
  if (RVar4.enum_ == Error) {
    fprintf(_stderr,"unable to read file: %s\n",s_infile);
    exit(1);
  }
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  module._M_t.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t.
  super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
  super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::Module,_std::default_delete<wabt::Module>,_true,_true>)
       (__uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parse_wast_options.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
  parse_wast_options.features.reference_types_enabled_ = s_features.reference_types_enabled_;
  parse_wast_options.features.annotations_enabled_ = s_features.annotations_enabled_;
  parse_wast_options.features.gc_enabled_ = s_features.gc_enabled_;
  parse_wast_options.features.memory64_enabled_ = s_features.memory64_enabled_;
  parse_wast_options.features.exceptions_enabled_ = s_features.exceptions_enabled_;
  parse_wast_options.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
  parse_wast_options.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
  parse_wast_options.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
  parse_wast_options.features.simd_enabled_ = s_features.simd_enabled_;
  parse_wast_options.features.threads_enabled_ = s_features.threads_enabled_;
  parse_wast_options.features.multi_value_enabled_ = s_features.multi_value_enabled_;
  parse_wast_options.features.tail_call_enabled_ = s_features.tail_call_enabled_;
  parse_wast_options.debug_parsing = false;
  RVar4 = wabt::ParseWatModule
                    ((WastLexer *)
                     lexer._M_t.
                     super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>
                     .super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl,&module,&errors,
                     &parse_wast_options);
  uVar7 = 1;
  if (RVar4.enum_ == Ok) {
    if (s_validate == '\0') {
      parser.program_name_._M_string_length._0_1_ = s_features.bulk_memory_enabled_;
      parser.program_name_._M_string_length._1_1_ = s_features.reference_types_enabled_;
      parser.program_name_._M_string_length._2_1_ = s_features.annotations_enabled_;
      parser.program_name_._M_string_length._3_1_ = s_features.gc_enabled_;
      parser.program_name_._M_string_length._4_1_ = s_features.memory64_enabled_;
      parser.program_name_._M_dataplus._M_p._0_1_ = s_features.exceptions_enabled_;
      parser.program_name_._M_dataplus._M_p._1_1_ = s_features.mutable_globals_enabled_;
      parser.program_name_._M_dataplus._M_p._2_1_ = s_features.sat_float_to_int_enabled_;
      parser.program_name_._M_dataplus._M_p._3_1_ = s_features.sign_extension_enabled_;
      parser.program_name_._M_dataplus._M_p._4_1_ = s_features.simd_enabled_;
      parser.program_name_._M_dataplus._M_p._5_1_ = s_features.threads_enabled_;
      parser.program_name_._M_dataplus._M_p._6_1_ = s_features.multi_value_enabled_;
      parser.program_name_._M_dataplus._M_p._7_1_ = s_features.tail_call_enabled_;
      RVar4 = wabt::ValidateModule
                        ((Module *)
                         module._M_t.
                         super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
                         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl,&errors,
                         (ValidateOptions *)&parser);
      if (RVar4.enum_ != Ok) goto LAB_0015eb96;
    }
    wabt::MemoryStream::MemoryStream
              ((MemoryStream *)&parser,
               (Stream *)
               s_log_stream._M_t.
               super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
               super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
               super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl);
    s_write_binary_options.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
    s_write_binary_options.features.reference_types_enabled_ = s_features.reference_types_enabled_;
    s_write_binary_options.features.annotations_enabled_ = s_features.annotations_enabled_;
    s_write_binary_options.features.gc_enabled_ = s_features.gc_enabled_;
    s_write_binary_options.features.memory64_enabled_ = s_features.memory64_enabled_;
    s_write_binary_options.features.exceptions_enabled_ = s_features.exceptions_enabled_;
    s_write_binary_options.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
    s_write_binary_options.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_
    ;
    s_write_binary_options.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
    s_write_binary_options.features.simd_enabled_ = s_features.simd_enabled_;
    s_write_binary_options.features.threads_enabled_ = s_features.threads_enabled_;
    s_write_binary_options.features.multi_value_enabled_ = s_features.multi_value_enabled_;
    s_write_binary_options.features.tail_call_enabled_ = s_features.tail_call_enabled_;
    RVar4 = wabt::WriteBinaryModule
                      ((Stream *)&parser,
                       (Module *)
                       module._M_t.
                       super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t.
                       super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
                       super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl,
                       &s_write_binary_options);
    pcVar3 = s_infile;
    if (RVar4.enum_ == Ok) {
      if (s_outfile_abi_cxx11_._M_string_length == 0) {
        pcVar5 = (char *)strlen(s_infile);
        filename_00.size_ = extraout_RDX;
        filename_00.data_ = pcVar5;
        sVar8 = wabt::GetBasename((wabt *)pcVar3,filename_00);
        filename_01.size_ = (char *)sVar8.size_;
        filename_01.data_ = filename_01.size_;
        local_38 = wabt::StripExtension((wabt *)sVar8.data_,filename_01);
        wabt::string_view::operator_cast_to_string((string *)&line_finder,&local_38);
        std::__cxx11::string::append((char *)&line_finder);
        std::__cxx11::string::operator=((string *)&s_outfile_abi_cxx11_,(string *)&line_finder);
        std::__cxx11::string::_M_dispose();
      }
      _Var2._M_p = s_outfile_abi_cxx11_._M_dataplus._M_p;
      sVar6 = strlen(s_outfile_abi_cxx11_._M_dataplus._M_p);
      if (s_dump_module == '\x01') {
        wabt::FileStream::CreateStdout();
        if (s_verbose != 0) {
          wabt::Stream::Writef
                    ((Stream *)
                     line_finder._M_t.
                     super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
                     .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl,
                     ";; dump\n");
        }
        start = *(void **)parser.description_._M_dataplus._M_p;
        if (start != *(void **)(parser.description_._M_dataplus._M_p + 8)) {
          wabt::Stream::WriteMemoryDump
                    ((Stream *)
                     line_finder._M_t.
                     super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
                     .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl,start
                     ,(long)*(void **)(parser.description_._M_dataplus._M_p + 8) - (long)start,0,No,
                     (char *)0x0,(char *)0x0);
        }
        if ((__uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
             )line_finder._M_t.
              super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
              ._M_t.
              super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
              .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
             )0x0) {
          (**(code **)(*(long *)line_finder._M_t.
                                super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
                                .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>.
                                _M_head_impl + 8))();
        }
      }
      filename_02.size_ = sVar6;
      filename_02.data_ = _Var2._M_p;
      wabt::OutputBuffer::WriteToFile
                ((OutputBuffer *)parser.description_._M_dataplus._M_p,filename_02);
    }
    wabt::MemoryStream::~MemoryStream((MemoryStream *)&parser);
    uVar7 = (uint)(RVar4.enum_ != Ok);
  }
LAB_0015eb96:
  wabt::WastLexer::MakeLineFinder((WastLexer *)&line_finder);
  paVar1 = &parser.program_name_.field_2;
  parser.program_name_._M_dataplus._M_p._0_5_ = SUB85(paVar1,0);
  parser.program_name_._M_dataplus._M_p._5_3_ = SUB83((ulong)paVar1 >> 0x28,0);
  parser.program_name_._M_string_length._0_5_ = 0;
  parser.program_name_._M_string_length._5_3_ = 0;
  parser.program_name_.field_2._M_local_buf[0] = '\0';
  wabt::FormatErrorsToFile
            (&errors,Text,
             (LexerSourceLineFinder *)
             line_finder._M_t.
             super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
             .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl,
             (FILE *)_stderr,&parser.program_name_,Never,0x50);
  std::__cxx11::string::_M_dispose();
  std::unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>::
  ~unique_ptr(&line_finder);
  std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::~unique_ptr(&module);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
  std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::~unique_ptr(&lexer);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return uVar7;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();

  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  Result result = ReadFile(s_infile, &file_data);
  std::unique_ptr<WastLexer> lexer = WastLexer::CreateBufferLexer(
      s_infile, file_data.data(), file_data.size());
  if (Failed(result)) {
    WABT_FATAL("unable to read file: %s\n", s_infile);
  }

  Errors errors;
  std::unique_ptr<Module> module;
  WastParseOptions parse_wast_options(s_features);
  result = ParseWatModule(lexer.get(), &module, &errors, &parse_wast_options);

  if (Succeeded(result) && s_validate) {
    ValidateOptions options(s_features);
    result = ValidateModule(module.get(), &errors, options);
  }

  if (Succeeded(result)) {
    MemoryStream stream(s_log_stream.get());
    s_write_binary_options.features = s_features;
    result = WriteBinaryModule(&stream, module.get(), s_write_binary_options);

    if (Succeeded(result)) {
      if (s_outfile.empty()) {
        s_outfile = DefaultOuputName(s_infile);
      }
      WriteBufferToFile(s_outfile.c_str(), stream.output_buffer());
    }
  }

  auto line_finder = lexer->MakeLineFinder();
  FormatErrorsToFile(errors, Location::Type::Text, line_finder.get());

  return result != Result::Ok;
}